

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O3

void __thiscall
TypeEnum::TypeEnum(TypeEnum *this,SynIdentifier *identifier,SynBase *source,ScopeData *scope)

{
  char *pcVar1;
  char *pcVar2;
  Lexeme *pLVar3;
  Lexeme *pLVar4;
  SynBase *pSVar5;
  undefined4 uVar6;
  bool bVar7;
  uint uVar8;
  
  pcVar1 = (identifier->name).begin;
  pcVar2 = (identifier->name).end;
  (this->super_TypeStruct).super_TypeBase._vptr_TypeBase = (_func_int **)&PTR__TypeBase_003e60b0;
  (this->super_TypeStruct).super_TypeBase.typeID = 0x19;
  (this->super_TypeStruct).super_TypeBase.name.begin = pcVar1;
  (this->super_TypeStruct).super_TypeBase.name.end = pcVar2;
  (this->super_TypeStruct).super_TypeBase.arrayTypes.head = (TypeHandle *)0x0;
  (this->super_TypeStruct).super_TypeBase.arrayTypes.tail = (TypeHandle *)0x0;
  uVar8 = NULLC::GetStringHash(pcVar1,pcVar2);
  (this->super_TypeStruct).super_TypeBase.nameHash = uVar8;
  (this->super_TypeStruct).super_TypeBase.importModule = (ModuleData *)0x0;
  (this->super_TypeStruct).super_TypeBase.typeIndex = 0xffffffff;
  (this->super_TypeStruct).super_TypeBase.refType = (TypeRef *)0x0;
  *(undefined8 *)&(this->super_TypeStruct).super_TypeBase.alignment = 0;
  *(undefined8 *)((long)&(this->super_TypeStruct).super_TypeBase.size + 4) = 0;
  *(undefined4 *)((long)&(this->super_TypeStruct).super_TypeBase.padding + 3) = 0;
  (this->super_TypeStruct).super_TypeBase.unsizedArrayType = (TypeUnsizedArray *)0x0;
  (this->super_TypeStruct).typeScope = (ScopeData *)0x0;
  (this->super_TypeStruct).members.head = (MemberHandle *)0x0;
  (this->super_TypeStruct).members.tail = (MemberHandle *)0x0;
  (this->super_TypeStruct).constants.head = (ConstantData *)0x0;
  (this->super_TypeStruct).constants.tail = (ConstantData *)0x0;
  (this->super_TypeStruct).super_TypeBase._vptr_TypeBase = (_func_int **)&PTR__TypeEnum_003e6ef0;
  (this->identifier).super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_003e61d8;
  uVar6 = *(undefined4 *)&(identifier->super_SynBase).field_0xc;
  pLVar3 = (identifier->super_SynBase).begin;
  pLVar4 = (identifier->super_SynBase).end;
  pcVar1 = (identifier->super_SynBase).pos.begin;
  pcVar2 = (identifier->super_SynBase).pos.end;
  pSVar5 = (identifier->super_SynBase).next;
  (this->identifier).super_SynBase.typeID = (identifier->super_SynBase).typeID;
  *(undefined4 *)&(this->identifier).super_SynBase.field_0xc = uVar6;
  (this->identifier).super_SynBase.begin = pLVar3;
  (this->identifier).super_SynBase.end = pLVar4;
  (this->identifier).super_SynBase.pos.begin = pcVar1;
  (this->identifier).super_SynBase.pos.end = pcVar2;
  (this->identifier).super_SynBase.next = pSVar5;
  bVar7 = (identifier->super_SynBase).isInternal;
  (this->identifier).super_SynBase.listed = (identifier->super_SynBase).listed;
  (this->identifier).super_SynBase.isInternal = bVar7;
  (this->identifier).super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
  pcVar1 = (identifier->name).end;
  (this->identifier).name.begin = (identifier->name).begin;
  (this->identifier).name.end = pcVar1;
  this->source = source;
  this->scope = scope;
  (this->super_TypeStruct).super_TypeBase.size = 4;
  (this->super_TypeStruct).super_TypeBase.alignment = 4;
  return;
}

Assistant:

TypeEnum(const SynIdentifier& identifier, SynBase *source, ScopeData *scope): TypeStruct(myTypeID, identifier.name), identifier(identifier), source(source), scope(scope)
	{
		size = 4;
		alignment = GetTypeAlignment<int>();
	}